

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O1

void operator_release(op_type *op_pt)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  if (1e-08 < op_pt->amp) {
    op_pt->amp = op_pt->amp * op_pt->releasemul;
  }
  uVar1 = op_pt->generator_pos;
  if (0xffff < uVar1) {
    uVar2 = uVar1 >> 0x10;
    uVar4 = op_pt->cur_env_step;
    lVar3 = (uVar2 - 1) + uVar4;
    do {
      uVar4 = uVar4 + 1;
      if ((op_pt->env_step_r & uVar4) == 0) {
        if ((op_pt->amp <= 1e-08) && (op_pt->amp = 0.0, op_pt->op_state == 2)) {
          op_pt->op_state = 5;
        }
        op_pt->step_amp = op_pt->amp;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    op_pt->cur_env_step = lVar3 + 1;
  }
  op_pt->generator_pos = uVar1 & 0xffff;
  return;
}

Assistant:

void operator_release(op_type* op_pt) {
	// ??? boundary?
	if (op_pt->amp > 0.00000001) {
		// release phase
		op_pt->amp *= op_pt->releasemul;
	}

	Bit32u num_steps_add = op_pt->generator_pos/FIXEDPT;	// number of (standardized) samples
	for (Bit32u ct=0; ct<num_steps_add; ct++) {
		op_pt->cur_env_step++;						// sample counter
		if ((op_pt->cur_env_step & op_pt->env_step_r)==0) {
			if (op_pt->amp <= 0.00000001) {
				// release phase finished, turn off this operator
				op_pt->amp = 0.0;
				if (op_pt->op_state == OF_TYPE_REL) {
					op_pt->op_state = OF_TYPE_OFF;
				}
			}
			op_pt->step_amp = op_pt->amp;
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}